

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::IsPrepassSrcValueInfoPrecise
          (GlobOpt *this,Opnd *src,Value *srcValue,bool *isSafeToTransferInPrepass)

{
  Sym *this_00;
  ValueInfo *srcValueInfo;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  RegOpnd *pRVar6;
  
  if (this->prePassLoop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1634,"(IsLoopPrePass())","IsLoopPrePass()");
    if (!bVar2) goto LAB_0042f618;
    *puVar4 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1635,"(src)","src");
    if (!bVar2) {
LAB_0042f618:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (isSafeToTransferInPrepass != (bool *)0x0) {
    *isSafeToTransferInPrepass = false;
  }
  bVar2 = IR::Opnd::IsAddrOpnd(src);
  if ((((bVar2) && (this_00 = srcValue->valueInfo->symStore, this_00 != (Sym *)0x0)) &&
      (this_00->m_kind == SymKindStack)) &&
     (pSVar5 = Sym::AsStackSym(this_00), (pSVar5->field_0x1a & 4) != 0)) {
    if (isSafeToTransferInPrepass == (bool *)0x0) {
      return true;
    }
    *isSafeToTransferInPrepass = false;
    return true;
  }
  bVar2 = IR::Opnd::IsRegOpnd(src);
  if (srcValue == (Value *)0x0 || !bVar2) {
    bVar2 = false;
  }
  else {
    srcValueInfo = srcValue->valueInfo;
    bVar2 = ValueType::IsDefinite(&srcValueInfo->super_ValueType);
    pRVar6 = IR::Opnd::AsRegOpnd(src);
    bVar3 = IsSafeToTransferInPrepass(this,pRVar6->m_sym,srcValueInfo);
    if (isSafeToTransferInPrepass != (bool *)0x0) {
      *isSafeToTransferInPrepass = bVar3;
    }
    bVar2 = bVar2 && bVar3;
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::IsPrepassSrcValueInfoPrecise(IR::Opnd *const src, Value *const srcValue, bool * isSafeToTransferInPrepass) const
{
    Assert(IsLoopPrePass());
    Assert(src);

    if (isSafeToTransferInPrepass)
    {
        *isSafeToTransferInPrepass = false;
    }

    if (src->IsAddrOpnd() &&
        srcValue->GetValueInfo()->GetSymStore() &&
        srcValue->GetValueInfo()->GetSymStore()->IsStackSym() &&
        srcValue->GetValueInfo()->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
    {
        if (isSafeToTransferInPrepass)
        {
            *isSafeToTransferInPrepass = false;
        }
        return true;
    }

    if (!src->IsRegOpnd() || !srcValue)
    {
        return false;
    }

    ValueInfo *const srcValueInfo = srcValue->GetValueInfo();
    bool isValueInfoDefinite = srcValueInfo->IsDefinite();

    StackSym * srcSym = src->AsRegOpnd()->m_sym;

    bool isSafeToTransfer = IsSafeToTransferInPrepass(srcSym, srcValueInfo);
    if (isSafeToTransferInPrepass)
    {
        *isSafeToTransferInPrepass = isSafeToTransfer;
    }

    return isValueInfoDefinite && isSafeToTransfer;
}